

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_DestroyEmptyDir::_Run(_Test_DestroyEmptyDir *this)

{
  int iVar1;
  TestEnv env;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  children;
  string dbname;
  Options opts;
  undefined1 local_278 [16];
  Env *local_268;
  undefined1 local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_258;
  int local_234;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  Status local_210;
  Tester local_208;
  Options local_68;
  
  test::TmpDir_abi_cxx11_();
  std::operator+(&local_230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208,
                 "/db_empty_dir");
  std::__cxx11::string::~string((string *)&local_208);
  local_268 = Env::Default();
  local_278._8_8_ = &PTR__EnvWrapper_00152c00;
  local_260 = 0;
  (*local_268->_vptr_Env[10])(&local_210,local_268,&local_230);
  Status::~Status(&local_210);
  test::Tester::Tester
            (&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x67c);
  iVar1 = (*local_268->_vptr_Env[6])(local_268,&local_230);
  test::Tester::Is(&local_208,(bool)((byte)iVar1 ^ 1),"!env.FileExists(dbname)");
  test::Tester::~Tester(&local_208);
  Options::Options(&local_68);
  local_68.env = (Env *)(local_278 + 8);
  test::Tester::Tester
            (&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x681);
  (*local_268->_vptr_Env[9])(&local_258,local_268,&local_230);
  test::Tester::IsOk(&local_208,(Status *)&local_258);
  Status::~Status((Status *)&local_258);
  test::Tester::~Tester(&local_208);
  test::Tester::Tester
            (&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x682);
  iVar1 = (*local_268->_vptr_Env[6])(local_268,&local_230);
  test::Tester::Is(&local_208,SUB41(iVar1,0),"env.FileExists(dbname)");
  test::Tester::~Tester(&local_208);
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  test::Tester::Tester
            (&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x684);
  TestEnv::GetChildren
            ((TestEnv *)local_278,(string *)(local_278 + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_230);
  test::Tester::IsOk(&local_208,(Status *)local_278);
  Status::~Status((Status *)local_278);
  test::Tester::~Tester(&local_208);
  test::Tester::Tester
            (&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x686);
  local_234 = 2;
  local_278._0_8_ =
       (long)local_258.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_258.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  test::Tester::IsEq<int,unsigned_long>(&local_208,&local_234,(unsigned_long *)local_278);
  test::Tester::~Tester(&local_208);
  test::Tester::Tester
            (&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x687);
  DestroyDB((leveldb *)local_278,&local_230,&local_68);
  test::Tester::IsOk(&local_208,(Status *)local_278);
  Status::~Status((Status *)local_278);
  test::Tester::~Tester(&local_208);
  test::Tester::Tester
            (&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x688);
  iVar1 = (*local_268->_vptr_Env[6])(local_268,&local_230);
  test::Tester::Is(&local_208,(bool)((byte)iVar1 ^ 1),"!env.FileExists(dbname)");
  test::Tester::~Tester(&local_208);
  local_260 = 1;
  test::Tester::Tester
            (&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x68c);
  (*local_268->_vptr_Env[9])(local_278,local_268,&local_230);
  test::Tester::IsOk(&local_208,(Status *)local_278);
  Status::~Status((Status *)local_278);
  test::Tester::~Tester(&local_208);
  test::Tester::Tester
            (&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x68d);
  iVar1 = (*local_268->_vptr_Env[6])(local_268,&local_230);
  test::Tester::Is(&local_208,SUB41(iVar1,0),"env.FileExists(dbname)");
  test::Tester::~Tester(&local_208);
  test::Tester::Tester
            (&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x68e);
  TestEnv::GetChildren
            ((TestEnv *)local_278,(string *)(local_278 + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_230);
  test::Tester::IsOk(&local_208,(Status *)local_278);
  Status::~Status((Status *)local_278);
  test::Tester::~Tester(&local_208);
  test::Tester::Tester
            (&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x68f);
  local_234 = 0;
  local_278._0_8_ =
       (long)local_258.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)local_258.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  test::Tester::IsEq<int,unsigned_long>(&local_208,&local_234,(unsigned_long *)local_278);
  test::Tester::~Tester(&local_208);
  test::Tester::Tester
            (&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x690);
  DestroyDB((leveldb *)local_278,&local_230,&local_68);
  test::Tester::IsOk(&local_208,(Status *)local_278);
  Status::~Status((Status *)local_278);
  test::Tester::~Tester(&local_208);
  test::Tester::Tester
            (&local_208,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x691);
  iVar1 = (*local_268->_vptr_Env[6])(local_268,&local_230);
  test::Tester::Is(&local_208,(bool)((byte)iVar1 ^ 1),"!env.FileExists(dbname)");
  test::Tester::~Tester(&local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_258);
  EnvWrapper::~EnvWrapper((EnvWrapper *)(local_278 + 8));
  std::__cxx11::string::~string((string *)&local_230);
  return;
}

Assistant:

TEST(DBTest, DestroyEmptyDir) {
  std::string dbname = test::TmpDir() + "/db_empty_dir";
  TestEnv env(Env::Default());
  env.DeleteDir(dbname);
  ASSERT_TRUE(!env.FileExists(dbname));

  Options opts;
  opts.env = &env;

  ASSERT_OK(env.CreateDir(dbname));
  ASSERT_TRUE(env.FileExists(dbname));
  std::vector<std::string> children;
  ASSERT_OK(env.GetChildren(dbname, &children));
  // The stock Env's do not filter out '.' and '..' special files.
  ASSERT_EQ(2, children.size());
  ASSERT_OK(DestroyDB(dbname, opts));
  ASSERT_TRUE(!env.FileExists(dbname));

  // Should also be destroyed if Env is filtering out dot files.
  env.SetIgnoreDotFiles(true);
  ASSERT_OK(env.CreateDir(dbname));
  ASSERT_TRUE(env.FileExists(dbname));
  ASSERT_OK(env.GetChildren(dbname, &children));
  ASSERT_EQ(0, children.size());
  ASSERT_OK(DestroyDB(dbname, opts));
  ASSERT_TRUE(!env.FileExists(dbname));
}